

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O0

int duckdb::Linenoise::ParseOption(char **azArg,int nArg,char **out_error)

{
  int iVar1;
  char *pcVar2;
  undefined8 *in_RDX;
  int in_ESI;
  undefined8 *in_RDI;
  HighlightingType type_1;
  HighlightingType type;
  char *option;
  char *in_stack_ffffffffffffffc8;
  HighlightingType in_stack_ffffffffffffffd4;
  HighlightingType type_00;
  
  iVar1 = strcmp((char *)*in_RDI,"highlight");
  if (iVar1 == 0) {
    if (in_ESI == 2) {
      iVar1 = strcmp((char *)in_RDI[1],"off");
      if ((iVar1 == 0) || (iVar1 = strcmp((char *)in_RDI[1],"0"), iVar1 == 0)) {
        Highlighting::Disable();
        return 1;
      }
      iVar1 = strcmp((char *)in_RDI[1],"on");
      if ((iVar1 == 0) || (iVar1 = strcmp((char *)in_RDI[1],"1"), iVar1 == 0)) {
        Highlighting::Enable();
        return 1;
      }
    }
    *in_RDX = "Expected usage: .highlight [off|on]";
    return 1;
  }
  iVar1 = strcmp((char *)*in_RDI,"render_errors");
  if (iVar1 == 0) {
    if (in_ESI == 2) {
      iVar1 = strcmp((char *)in_RDI[1],"off");
      if ((iVar1 == 0) || (iVar1 = strcmp((char *)in_RDI[1],"0"), iVar1 == 0)) {
        DisableErrorRendering();
        return 1;
      }
      iVar1 = strcmp((char *)in_RDI[1],"on");
      if ((iVar1 == 0) || (iVar1 = strcmp((char *)in_RDI[1],"1"), iVar1 == 0)) {
        EnableErrorRendering();
        return 1;
      }
    }
    *in_RDX = "Expected usage: .render_errors [off|on]";
    return 1;
  }
  iVar1 = strcmp((char *)*in_RDI,"render_completion");
  if (iVar1 == 0) {
    if (in_ESI == 2) {
      iVar1 = strcmp((char *)in_RDI[1],"off");
      if ((iVar1 == 0) || (iVar1 = strcmp((char *)in_RDI[1],"0"), iVar1 == 0)) {
        DisableCompletionRendering();
        return 1;
      }
      iVar1 = strcmp((char *)in_RDI[1],"on");
      if ((iVar1 == 0) || (iVar1 = strcmp((char *)in_RDI[1],"1"), iVar1 == 0)) {
        EnableCompletionRendering();
        return 1;
      }
    }
    *in_RDX = "Expected usage: .render_completion [off|on]";
    return 1;
  }
  iVar1 = strcmp((char *)*in_RDI,"keyword");
  if (((((iVar1 == 0) || (iVar1 = strcmp((char *)*in_RDI,"constant"), iVar1 == 0)) ||
       (iVar1 = strcmp((char *)*in_RDI,"comment"), iVar1 == 0)) ||
      ((iVar1 = strcmp((char *)*in_RDI,"error"), iVar1 == 0 ||
       (iVar1 = strcmp((char *)*in_RDI,"cont"), iVar1 == 0)))) ||
     (iVar1 = strcmp((char *)*in_RDI,"cont_sel"), iVar1 == 0)) {
    if ((in_ESI == 2) &&
       (pcVar2 = Highlighting::GetColorOption(in_stack_ffffffffffffffc8), pcVar2 != (char *)0x0)) {
      iVar1 = strcmp((char *)*in_RDI,"keyword");
      if (iVar1 == 0) {
        type_00 = KEYWORD;
      }
      else {
        iVar1 = strcmp((char *)*in_RDI,"constant");
        if (iVar1 == 0) {
          type_00 = CONSTANT;
        }
        else {
          iVar1 = strcmp((char *)*in_RDI,"comment");
          if (iVar1 == 0) {
            type_00 = COMMENT;
          }
          else {
            iVar1 = strcmp((char *)*in_RDI,"error");
            if (iVar1 == 0) {
              type_00 = ERROR;
            }
            else {
              iVar1 = strcmp((char *)*in_RDI,"cont");
              if (iVar1 == 0) {
                type_00 = CONTINUATION;
              }
              else {
                type_00 = CONTINUATION_SELECTED;
              }
            }
          }
        }
      }
      Highlighting::SetHighlightingColor(type_00,in_stack_ffffffffffffffc8);
      return 1;
    }
    *in_RDX = 
    "Expected usage: .[keyword|constant|comment|error|cont|cont_sel] [red|green|yellow|blue|magenta|cyan|white|brightblack|brightred|brightgreen|brightyellow|brightblue|brightmagenta|brightcyan|brightwhite]"
    ;
    return 1;
  }
  iVar1 = strcmp((char *)*in_RDI,"keywordcode");
  if ((((iVar1 == 0) || (iVar1 = strcmp((char *)*in_RDI,"constantcode"), iVar1 == 0)) ||
      (iVar1 = strcmp((char *)*in_RDI,"commentcode"), iVar1 == 0)) ||
     (((iVar1 = strcmp((char *)*in_RDI,"errorcode"), iVar1 == 0 ||
       (iVar1 = strcmp((char *)*in_RDI,"contcode"), iVar1 == 0)) ||
      (iVar1 = strcmp((char *)*in_RDI,"cont_selcode"), iVar1 == 0)))) {
    if (in_ESI == 2) {
      iVar1 = strcmp((char *)*in_RDI,"keywordcode");
      if (((iVar1 != 0) && (iVar1 = strcmp((char *)*in_RDI,"constantcode"), iVar1 != 0)) &&
         ((iVar1 = strcmp((char *)*in_RDI,"commentcode"), iVar1 != 0 &&
          (iVar1 = strcmp((char *)*in_RDI,"errorcode"), iVar1 != 0)))) {
        strcmp((char *)*in_RDI,"contcode");
      }
      Highlighting::SetHighlightingColor(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8);
      return 1;
    }
    *in_RDX = 
    "Expected usage: .[keywordcode|constantcode|commentcode|errorcode|contcode|cont_selcode] [terminal_code]"
    ;
    return 1;
  }
  iVar1 = strcmp((char *)*in_RDI,"multiline");
  if (iVar1 == 0) {
    linenoiseSetMultiLine(0);
    return 1;
  }
  iVar1 = strcmp((char *)*in_RDI,"singleline");
  if (iVar1 == 0) {
    linenoiseSetMultiLine(0);
    return 1;
  }
  return 0;
}

Assistant:

int Linenoise::ParseOption(const char **azArg, int nArg, const char **out_error) {
	if (strcmp(azArg[0], "highlight") == 0) {
		if (nArg == 2) {
			if (strcmp(azArg[1], "off") == 0 || strcmp(azArg[1], "0") == 0) {
				Highlighting::Disable();
				return 1;
			} else if (strcmp(azArg[1], "on") == 0 || strcmp(azArg[1], "1") == 0) {
				Highlighting::Enable();
				return 1;
			}
		}
		*out_error = "Expected usage: .highlight [off|on]";
		return 1;
	} else if (strcmp(azArg[0], "render_errors") == 0) {
		if (nArg == 2) {
			if (strcmp(azArg[1], "off") == 0 || strcmp(azArg[1], "0") == 0) {
				Linenoise::DisableErrorRendering();
				return 1;
			} else if (strcmp(azArg[1], "on") == 0 || strcmp(azArg[1], "1") == 0) {
				Linenoise::EnableErrorRendering();
				return 1;
			}
		}
		*out_error = "Expected usage: .render_errors [off|on]";
		return 1;
	} else if (strcmp(azArg[0], "render_completion") == 0) {
		if (nArg == 2) {
			if (strcmp(azArg[1], "off") == 0 || strcmp(azArg[1], "0") == 0) {
				Linenoise::DisableCompletionRendering();
				return 1;
			} else if (strcmp(azArg[1], "on") == 0 || strcmp(azArg[1], "1") == 0) {
				Linenoise::EnableCompletionRendering();
				return 1;
			}
		}
		*out_error = "Expected usage: .render_completion [off|on]";
		return 1;
	} else if (strcmp(azArg[0], "keyword") == 0 || strcmp(azArg[0], "constant") == 0 ||
	           strcmp(azArg[0], "comment") == 0 || strcmp(azArg[0], "error") == 0 || strcmp(azArg[0], "cont") == 0 ||
	           strcmp(azArg[0], "cont_sel") == 0) {
		if (nArg == 2) {
			const char *option = Highlighting::GetColorOption(azArg[1]);
			if (option) {
				HighlightingType type;
				if (strcmp(azArg[0], "keyword") == 0) {
					type = HighlightingType::KEYWORD;
				} else if (strcmp(azArg[0], "constant") == 0) {
					type = HighlightingType::CONSTANT;
				} else if (strcmp(azArg[0], "comment") == 0) {
					type = HighlightingType::COMMENT;
				} else if (strcmp(azArg[0], "error") == 0) {
					type = HighlightingType::ERROR;
				} else if (strcmp(azArg[0], "cont") == 0) {
					type = HighlightingType::CONTINUATION;
				} else {
					type = HighlightingType::CONTINUATION_SELECTED;
				}
				Highlighting::SetHighlightingColor(type, option);
				return 1;
			}
		}
		*out_error = "Expected usage: .[keyword|constant|comment|error|cont|cont_sel] "
		             "[red|green|yellow|blue|magenta|cyan|white|brightblack|brightred|brightgreen|brightyellow|"
		             "brightblue|brightmagenta|brightcyan|brightwhite]";
		return 1;
	} else if (strcmp(azArg[0], "keywordcode") == 0 || strcmp(azArg[0], "constantcode") == 0 ||
	           strcmp(azArg[0], "commentcode") == 0 || strcmp(azArg[0], "errorcode") == 0 ||
	           strcmp(azArg[0], "contcode") == 0 || strcmp(azArg[0], "cont_selcode") == 0) {
		if (nArg == 2) {
			HighlightingType type;
			if (strcmp(azArg[0], "keywordcode") == 0) {
				type = HighlightingType::KEYWORD;
			} else if (strcmp(azArg[0], "constantcode") == 0) {
				type = HighlightingType::CONSTANT;
			} else if (strcmp(azArg[0], "commentcode") == 0) {
				type = HighlightingType::COMMENT;
			} else if (strcmp(azArg[0], "errorcode") == 0) {
				type = HighlightingType::ERROR;
			} else if (strcmp(azArg[0], "contcode") == 0) {
				type = HighlightingType::CONTINUATION;
			} else {
				type = HighlightingType::CONTINUATION_SELECTED;
			}
			Highlighting::SetHighlightingColor(type, azArg[1]);
			return 1;
		}
		*out_error =
		    "Expected usage: .[keywordcode|constantcode|commentcode|errorcode|contcode|cont_selcode] [terminal_code]";
		return 1;
	} else if (strcmp(azArg[0], "multiline") == 0) {
		linenoiseSetMultiLine(1);
		return 1;
	} else if (strcmp(azArg[0], "singleline") == 0) {
		linenoiseSetMultiLine(0);
		return 1;
	}
	return 0;
}